

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int luaopen_package(lua_State *L)

{
  int local_14;
  int i;
  lua_State *L_local;
  
  luaL_newmetatable(L,"_LOADLIB");
  lua_pushcclosure(L,gctm,0);
  lua_setfield(L,-2,"__gc");
  luaL_register(L,"package",pk_funcs);
  lua_pushvalue(L,-1);
  lua_replace(L,-0x2711);
  lua_createtable(L,4,0);
  for (local_14 = 0; loaders[local_14] != (lua_CFunction)0x0; local_14 = local_14 + 1) {
    lua_pushcclosure(L,loaders[local_14],0);
    lua_rawseti(L,-2,local_14 + 1);
  }
  lua_setfield(L,-2,"loaders");
  setpath(L,"path","LUA_PATH",
          "./?.lua;/usr/local/share/lua/5.1/?.lua;/usr/local/share/lua/5.1/?/init.lua;/usr/local/lib/lua/5.1/?.lua;/usr/local/lib/lua/5.1/?/init.lua"
         );
  setpath(L,"cpath","LUA_CPATH",
          "./?.so;/usr/local/lib/lua/5.1/?.so;/usr/local/lib/lua/5.1/loadall.so");
  lua_pushlstring(L,"/\n;\n?\n!\n-",9);
  lua_setfield(L,-2,"config");
  luaL_findtable(L,-10000,"_LOADED",2);
  lua_setfield(L,-2,"loaded");
  lua_createtable(L,0,0);
  lua_setfield(L,-2,"preload");
  lua_pushvalue(L,-0x2712);
  luaL_register(L,(char *)0x0,ll_funcs);
  lua_settop(L,-2);
  return 1;
}

Assistant:

LUALIB_API int luaopen_package (lua_State *L) {
  int i;
  /* create new type _LOADLIB */
  luaL_newmetatable(L, "_LOADLIB");
  lua_pushcfunction(L, gctm);
  lua_setfield(L, -2, "__gc");
  /* create `package' table */
  luaL_register(L, LUA_LOADLIBNAME, pk_funcs);
#if defined(LUA_COMPAT_LOADLIB) 
  lua_getfield(L, -1, "loadlib");
  lua_setfield(L, LUA_GLOBALSINDEX, "loadlib");
#endif
  lua_pushvalue(L, -1);
  lua_replace(L, LUA_ENVIRONINDEX);
  /* create `loaders' table */
  lua_createtable(L, sizeof(loaders)/sizeof(loaders[0]) - 1, 0);
  /* fill it with pre-defined loaders */
  for (i=0; loaders[i] != NULL; i++) {
    lua_pushcfunction(L, loaders[i]);
    lua_rawseti(L, -2, i+1);
  }
  lua_setfield(L, -2, "loaders");  /* put it in field `loaders' */
  setpath(L, "path", LUA_PATH, LUA_PATH_DEFAULT);  /* set field `path' */
  setpath(L, "cpath", LUA_CPATH, LUA_CPATH_DEFAULT); /* set field `cpath' */
  /* store config information */
  lua_pushliteral(L, LUA_DIRSEP "\n" LUA_PATHSEP "\n" LUA_PATH_MARK "\n"
                     LUA_EXECDIR "\n" LUA_IGMARK);
  lua_setfield(L, -2, "config");
  /* set field `loaded' */
  luaL_findtable(L, LUA_REGISTRYINDEX, "_LOADED", 2);
  lua_setfield(L, -2, "loaded");
  /* set field `preload' */
  lua_newtable(L);
  lua_setfield(L, -2, "preload");
  lua_pushvalue(L, LUA_GLOBALSINDEX);
  luaL_register(L, NULL, ll_funcs);  /* open lib into global table */
  lua_pop(L, 1);
  return 1;  /* return 'package' table */
}